

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

Pattern * __thiscall docopt::BranchPattern::fix(BranchPattern *this)

{
  undefined1 local_48 [8];
  UniquePatternSet patterns;
  BranchPattern *this_local;
  
  patterns._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_set<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::unordered_set((unordered_set<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)local_48);
  (*(this->super_Pattern)._vptr_Pattern[9])
            (this,(unordered_set<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)local_48);
  fix_repeating_arguments(this);
  std::
  unordered_set<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)local_48);
  return &this->super_Pattern;
}

Assistant:

Pattern& fix() {
			UniquePatternSet patterns;
			fix_identities(patterns);
			fix_repeating_arguments();
			return *this;
		}